

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlElement::TiXmlElement(TiXmlElement *this,char *_value)

{
  char *_value_local;
  TiXmlElement *this_local;
  
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,ELEMENT);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlElement_0026f490;
  TiXmlAttributeSet::TiXmlAttributeSet(&this->attributeSet);
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  TiXmlString::operator=(&(this->super_TiXmlNode).value,_value);
  return;
}

Assistant:

TiXmlElement::TiXmlElement(const char * _value) :
	TiXmlNode(TiXmlNode::ELEMENT) {
	firstChild = lastChild = 0;
	value = _value;
}